

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O2

bool __thiscall
randomx::SuperscalarInstruction::selectSource
          (SuperscalarInstruction *this,int cycle,RegisterInfo (*registers) [8],Blake2Generator *gen
          )

{
  bool bVar1;
  int iVar2;
  uint i;
  long lVar3;
  int local_5c;
  vector<int,_std::allocator<int>_> availableRegisters;
  
  availableRegisters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  availableRegisters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  availableRegisters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    if (((RegisterInfo *)&(*registers)[0].latency)->latency <= cycle) {
      local_5c = (int)lVar3;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&availableRegisters,&local_5c);
    }
    registers = (RegisterInfo (*) [8])((long)registers + 0x10);
  }
  if ((((long)availableRegisters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)availableRegisters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start == 8) && (this->info_->type_ == IADD_RS)) &&
     ((*availableRegisters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start == 5 ||
      (availableRegisters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[1] == 5)))) {
    this->src_ = 5;
    iVar2 = 5;
  }
  else {
    bVar1 = selectRegister(&availableRegisters,gen,&this->src_);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0011febf;
    }
    bVar1 = true;
    if (this->groupParIsSource_ != true) goto LAB_0011febf;
    iVar2 = this->src_;
  }
  this->opGroupPar_ = iVar2;
  bVar1 = true;
LAB_0011febf:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&availableRegisters.super__Vector_base<int,_std::allocator<int>_>);
  return bVar1;
}

Assistant:

bool selectSource(int cycle, RegisterInfo(&registers)[8], Blake2Generator& gen) {
			std::vector<int> availableRegisters;
			//all registers that are ready at the cycle
			for (unsigned i = 0; i < 8; ++i) {
				if (registers[i].latency <= cycle)
					availableRegisters.push_back(i);
			}
			//if there are only 2 available registers for IADD_RS and one of them is r5, select it as the source because it cannot be the destination
			if (availableRegisters.size() == 2 && info_->getType() == SuperscalarInstructionType::IADD_RS) {
				if (availableRegisters[0] == RegisterNeedsDisplacement || availableRegisters[1] == RegisterNeedsDisplacement) {
					opGroupPar_ = src_ = RegisterNeedsDisplacement;
					return true;
				}
			}
			if (selectRegister(availableRegisters, gen, src_)) {
				if (groupParIsSource_)
					opGroupPar_ = src_;
				return true;
			}
			return false;
		}